

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult PrintArguments(ShellState *state,char **azArg,idx_t nArg)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  idx_t i;
  ulong local_20;
  
  for (local_20 = 1; local_20 < in_RDX; local_20 = local_20 + 1) {
    if (1 < local_20) {
      fprintf(*(FILE **)(in_RDI + 0x20)," ");
    }
    fprintf(*(FILE **)(in_RDI + 0x20),"%s",*(undefined8 *)(in_RSI + local_20 * 8));
  }
  fprintf(*(FILE **)(in_RDI + 0x20),anon_var_dwarf_3eb6436 + 8);
  return SUCCESS;
}

Assistant:

MetadataResult PrintArguments(ShellState &state, const char **azArg, idx_t nArg) {
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			raw_printf(state.out, " ");
		}
		utf8_printf(state.out, "%s", azArg[i]);
	}
	raw_printf(state.out, "\n");
	return MetadataResult::SUCCESS;
}